

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O2

bool axl::io::ensureDirExists(StringRef *fileName0)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  C *pCVar4;
  char *pcVar5;
  bool bVar6;
  char *__path;
  String fileName;
  StringRef local_48;
  
  bVar6 = true;
  if ((fileName0->m_length != 0) && (bVar1 = isDir(fileName0), !bVar1)) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_48,fileName0);
    pCVar4 = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::getBuffer
                       ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)&local_48);
    pcVar5 = pCVar4 + -1;
    do {
      cVar2 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
    } while (cVar2 == '/');
    while (bVar6 = true, cVar2 != '\0') {
      do {
        cVar2 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
        if (cVar2 == '/') break;
      } while (cVar2 != '\0');
      *pcVar5 = '\0';
      bVar1 = isDir(&local_48);
      if (!bVar1) {
        __path = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        if (local_48.m_length != 0) {
          __path = local_48.m_p;
        }
        iVar3 = mkdir(__path,0x1c0);
        if (iVar3 != 0) {
          err::setLastSystemError();
          bVar6 = false;
          break;
        }
      }
      if (cVar2 == '\0') break;
      *pcVar5 = cVar2;
      do {
        cVar2 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      } while (cVar2 == '/');
    }
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_48);
  }
  return bVar6;
}

Assistant:

bool
ensureDirExists(const sl::StringRef& fileName0) {
	if (fileName0.isEmpty() || isDir(fileName0))
		return true;

	sl::String fileName = fileName0;

	char* p = fileName.getBuffer(); // ensure exclusive buffer (we're going to modify it)
	while (*p == '/') // skip root
		p++;

	while (*p) {
		char* p2 = p + 1;
		while (*p2 && *p2 != '/')
			p2++;

		char c = *p2; // save
		*p2 = 0;

		if (!isDir(fileName)) {
			int result = ::mkdir(fileName, S_IRWXU);
			if (result != 0)
				return err::failWithLastSystemError();
		}

		if (!c)
			break;

		*p2 = c; // restore

		p = p2 + 1;
		while (*p == '/') // skip separators
			p++;
	}

	return true;
}